

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

void __thiscall
spectest::CommandRunner::PopulateExports(CommandRunner *this,Ptr *instance,ExportMap *map)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  long lVar3;
  ulong uVar4;
  pointer pEVar5;
  Ptr module;
  RefPtr<wabt::interp::Module> local_68;
  RefPtr<wabt::interp::Extern> local_48;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
  ::_M_erase(&map->_M_t,(_Link_type)(map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var1 = &(map->_M_t)._M_impl.super__Rb_tree_header;
  (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (map->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            (&local_68,&this->store_,(Ref)(instance->obj_->module_).index);
  pEVar5 = ((local_68.obj_)->export_types_).
           super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((local_68.obj_)->export_types_).
      super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar5) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr
                (&local_48,&this->store_,
                 (Ref)(instance->obj_->exports_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar4].index);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
               ::operator[](map,(key_type *)((long)&(pEVar5->name)._M_dataplus._M_p + lVar3));
      pmVar2->obj_ = local_48.obj_;
      pmVar2->store_ = local_48.store_;
      pmVar2->root_index_ = local_48.root_index_;
      uVar4 = uVar4 + 1;
      pEVar5 = ((local_68.obj_)->export_types_).
               super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (ulong)(((long)((local_68.obj_)->export_types_).
                                    super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar5 >> 3)
                            * -0x3333333333333333));
  }
  if (local_68.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_68.store_,local_68.root_index_);
  }
  return;
}

Assistant:

void CommandRunner::PopulateExports(const Instance::Ptr& instance,
                                    ExportMap* map) {
  map->clear();
  interp::Module::Ptr module{store_, instance->module()};
  for (size_t i = 0; i < module->export_types().size(); ++i) {
    const ExportType& export_type = module->export_types()[i];
    (*map)[export_type.name] = store_.UnsafeGet<Extern>(instance->exports()[i]);
  }
}